

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NonlinearSolvers.cpp
# Opt level: O0

double DiscreteNewtonsMethod(double start,Func1D *f,double h,double eps,int *iterations)

{
  double dVar1;
  Func1D local_78;
  undefined1 local_58 [8];
  anon_class_40_2_94731ee7 df;
  int *iterations_local;
  double eps_local;
  double h_local;
  Func1D *f_local;
  double start_local;
  
  local_58 = (undefined1  [8])h;
  df.f._M_invoker = (_Invoker_type)iterations;
  std::function<double_(double)>::function((function<double_(double)> *)&df,f);
  std::function<double(double)>::
  function<DiscreteNewtonsMethod(double,std::function<double(double)>const&,double,double,int&)::__0&,void>
            ((function<double(double)> *)&local_78,(anon_class_40_2_94731ee7 *)local_58);
  dVar1 = NewtonsMethod(start,f,&local_78,eps,(int *)df.f._M_invoker);
  std::function<double_(double)>::~function(&local_78);
  DiscreteNewtonsMethod(double,std::function<double(double)>const&,double,double,int&)::$_0::~__0
            ((__0 *)local_58);
  return dVar1;
}

Assistant:

double DiscreteNewtonsMethod(double start, const Func1D &f, double h, double eps, int &iterations)
{
    auto df = [h, f](double x)
    { return (f(x + h) - f(x)) / h; };

    return NewtonsMethod(start, f, df, eps, iterations);
}